

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

Vector3D * __thiscall
CGL::PathTracer::one_bounce_radiance(PathTracer *this,Ray *r,Intersection *isect)

{
  long in_RSI;
  Vector3D *in_RDI;
  Intersection *in_stack_00000418;
  Ray *in_stack_00000420;
  PathTracer *in_stack_00000428;
  Intersection *in_stack_00000488;
  Ray *in_stack_00000490;
  PathTracer *in_stack_00000498;
  
  if ((*(byte *)(in_RSI + 0x78) & 1) == 0) {
    estimate_direct_lighting_importance(in_stack_00000498,in_stack_00000490,in_stack_00000488);
  }
  else {
    estimate_direct_lighting_hemisphere(in_stack_00000428,in_stack_00000420,in_stack_00000418);
  }
  return in_RDI;
}

Assistant:

Vector3D PathTracer::one_bounce_radiance(const Ray &r,
                                         const Intersection &isect) {
  // TODO: Part 3, Task 3
  // Returns either the direct illumination by hemisphere or importance sampling
  // depending on `direct_hemisphere_sample`
  if (direct_hemisphere_sample) {
    return estimate_direct_lighting_hemisphere(r, isect);
  }

  return estimate_direct_lighting_importance(r, isect);
}